

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_unittest.cpp
# Opt level: O0

void __thiscall MyClass::MyClass(MyClass *this)

{
  ostream *poVar1;
  void *this_00;
  MyClass *this_local;
  
  this->val_ = -99;
  poVar1 = std::operator<<((ostream *)&std::cerr,"MyClass DEFAULT CONSTRUCTOR: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->val_);
  poVar1 = std::operator<<(poVar1," this: ");
  this_00 = (void *)std::ostream::operator<<(poVar1,this);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

MyClass () {
        std::cerr << "MyClass DEFAULT CONSTRUCTOR: " << val_ << " this: " << this <<  std::endl;
        //  = default;  TODO: We should not need this
    }